

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupBlock(Gia_Man_t *p,int nBlock)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  uint local_40;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int nBlock_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCiNum(p);
  if (iVar1 % nBlock != 0) {
    __assert_fail("Gia_ManCiNum(p) % nBlock == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x6bd,"Gia_Man_t *Gia_ManDupBlock(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManCoNum(p);
  if (iVar1 % nBlock != 0) {
    __assert_fail("Gia_ManCoNum(p) % nBlock == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x6be,"Gia_Man_t *Gia_ManDupBlock(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(p,local_34);
      bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    if (local_34 % nBlock == 0) {
      local_40 = Gia_ManAppendCi(p_00);
    }
    else {
      local_40 = 0;
    }
    pGStack_30->Value = local_40;
    local_34 = local_34 + 1;
  }
  Gia_ManHashAlloc(p_00);
  local_34 = 0;
  while( true ) {
    bVar6 = false;
    if (local_34 < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,local_34);
      bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iLit1 = Gia_ObjFanin1Copy(pGStack_30);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
      pGStack_30->Value = uVar2;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(p,local_34);
      bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    if (local_34 % nBlock == 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      Gia_ManAppendCo(p_00,iVar1);
    }
    local_34 = local_34 + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1 / nBlock);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManDupBlock( Gia_Man_t * p, int nBlock )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; int i;
    assert( Gia_ManCiNum(p) % nBlock == 0 );
    assert( Gia_ManCoNum(p) % nBlock == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = (i % nBlock == 0) ? Gia_ManAppendCi(pNew) : 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nBlock == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/nBlock );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}